

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disflow_avx2.c
# Opt level: O1

void aom_compute_flow_at_point_avx2
               (uint8_t *src,uint8_t *ref,int x,int y,int width,int height,int stride,double *u,
               double *v)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  ulong uVar9;
  int iVar10;
  long lVar11;
  undefined1 (*pauVar12) [32];
  int iVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  long lVar17;
  uint8_t *puVar18;
  int iVar19;
  undefined1 (*pauVar20) [16];
  undefined4 uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [64];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [64];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [64];
  double dVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [16];
  int16_t tmp_ [96];
  int16_t dy [64];
  int16_t dx [64];
  undefined1 local_220 [16];
  undefined1 auStack_210 [16];
  undefined1 auStack_200 [16];
  undefined1 auStack_1f0 [144];
  undefined1 auStack_160 [128];
  undefined1 auStack_e0 [176];
  
  auVar8 = _DAT_005184e0;
  auVar7 = _DAT_005184c0;
  uVar9 = (ulong)stride;
  lVar11 = (long)(stride * y + x);
  pauVar20 = (undefined1 (*) [16])(src + lVar11 + -1);
  auVar31._0_16_ =
       ZEXT116(0) * *pauVar20 + ZEXT116(1) * *(undefined1 (*) [16])(src + ~uVar9 + lVar11);
  auVar31._16_16_ = ZEXT116(1) * *pauVar20;
  auVar54 = vpshufb_avx2(auVar31,_DAT_005185c0);
  auVar34 = vpunpcklbw_avx2(auVar31,ZEXT1632((undefined1  [16])0x0));
  auVar26 = vpshufb_avx2(auVar31,_DAT_005185e0);
  auVar31 = vpaddw_avx2(auVar26,auVar34);
  auVar54 = vpaddw_avx2(auVar54,auVar54);
  auVar31 = vpaddw_avx2(auVar31,auVar54);
  auVar54 = vpsubw_avx2(auVar34,auVar26);
  lVar11 = uVar9 * 2;
  uVar15 = 0xfffffffffffffffe;
  lVar17 = 0;
  auVar26._16_16_ = _DAT_00518620;
  auVar26._0_16_ = _DAT_00518620;
  auVar34._16_16_ = _DAT_00518630;
  auVar34._0_16_ = _DAT_00518630;
  do {
    auVar33._0_16_ =
         ZEXT116(0) * *(undefined1 (*) [16])(*pauVar20 + uVar9 * 2) +
         ZEXT116(1) * *(undefined1 (*) [16])(*pauVar20 + uVar9);
    auVar33._16_16_ =
         ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
         ZEXT116(1) * *(undefined1 (*) [16])(*pauVar20 + uVar9 * 2);
    auVar46 = vpunpcklbw_avx2(auVar33,ZEXT1632((undefined1  [16])0x0));
    auVar55 = vpshufb_avx2(auVar33,auVar26);
    auVar56 = vpshufb_avx2(auVar33,auVar34);
    auVar33 = vpaddw_avx2(auVar56,auVar46);
    auVar55 = vpaddw_avx2(auVar55,auVar55);
    auVar33 = vpaddw_avx2(auVar33,auVar55);
    auVar56 = vpsubw_avx2(auVar46,auVar56);
    auVar55 = vpaddw_avx2(auVar56,auVar54);
    auVar54 = vperm2i128_avx2(auVar54,auVar56,0x21);
    auVar54 = vpaddw_avx2(auVar54,auVar54);
    auVar54 = vpaddw_avx2(auVar55,auVar54);
    auVar31 = vpsubw_avx2(auVar31,auVar33);
    *(undefined1 (*) [32])(auStack_e0 + lVar17) = auVar54;
    *(undefined1 (*) [32])(auStack_160 + lVar17) = auVar31;
    pauVar20 = (undefined1 (*) [16])(*pauVar20 + lVar11);
    uVar15 = uVar15 + 2;
    lVar17 = lVar17 + 0x20;
    auVar31 = auVar33;
    auVar54 = auVar56;
  } while (uVar15 < 6);
  auVar27 = ZEXT1664((undefined1  [16])0x0);
  uVar15 = 0xfffffffffffffffe;
  lVar17 = 0;
  auVar35 = ZEXT1664((undefined1  [16])0x0);
  auVar39 = ZEXT1664((undefined1  [16])0x0);
  do {
    auVar31 = *(undefined1 (*) [32])(auStack_e0 + lVar17);
    auVar54 = *(undefined1 (*) [32])(auStack_160 + lVar17);
    auVar26 = vpmaddwd_avx2(auVar31,auVar31);
    auVar26 = vpaddd_avx2(auVar26,auVar39._0_32_);
    auVar39 = ZEXT3264(auVar26);
    auVar31 = vpmaddwd_avx2(auVar31,auVar54);
    auVar31 = vpaddd_avx2(auVar31,auVar35._0_32_);
    auVar35 = ZEXT3264(auVar31);
    auVar54 = vpmaddwd_avx2(auVar54,auVar54);
    auVar54 = vpaddd_avx2(auVar54,auVar27._0_32_);
    auVar27 = ZEXT3264(auVar54);
    uVar15 = uVar15 + 2;
    lVar17 = lVar17 + 0x20;
  } while (uVar15 < 6);
  auVar26 = vphaddd_avx2(auVar26,auVar31);
  auVar31 = vphaddd_avx2(auVar31,auVar54);
  auVar31 = vphaddd_avx2(auVar26,auVar31);
  auVar4 = vpaddd_avx(auVar31._16_16_,auVar31._0_16_);
  auVar4 = vpaddd_avx(auVar4,_DAT_005174e0);
  auVar31 = vcvtdq2pd_avx(auVar4);
  auVar4 = vshufpd_avx(auVar31._16_16_,auVar31._16_16_,1);
  auVar5 = vshufpd_avx(auVar31._0_16_,auVar31._0_16_,1);
  dVar40 = 1.0 / (auVar31._0_8_ * auVar4._0_8_ - auVar31._16_8_ * auVar5._0_8_);
  iVar19 = 0;
  auVar54._16_16_ = _DAT_00518640;
  auVar54._0_16_ = _DAT_00518640;
  auVar55._8_4_ = 0x80;
  auVar55._0_8_ = 0x8000000080;
  auVar55._12_4_ = 0x80;
  auVar55._16_4_ = 0x80;
  auVar55._20_4_ = 0x80;
  auVar55._24_4_ = 0x80;
  auVar55._28_4_ = 0x80;
  auVar56._8_4_ = 0x10000;
  auVar56._0_8_ = 0x1000000010000;
  auVar56._12_4_ = 0x10000;
  auVar56._16_4_ = 0x10000;
  auVar56._20_4_ = 0x10000;
  auVar56._24_4_ = 0x10000;
  auVar56._28_4_ = 0x10000;
  do {
    dVar1 = *u;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = dVar1;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = *v;
    auVar30 = vroundsd_avx(auVar22,auVar22,9);
    auVar36 = vroundsd_avx(auVar41,auVar41,9);
    auVar42._8_8_ = 0;
    auVar42._0_8_ = *v - auVar36._0_8_;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = dVar1 - auVar30._0_8_;
    auVar22 = vunpcklpd_avx(auVar48,auVar42);
    dVar2 = auVar22._0_8_;
    auVar49._0_8_ = dVar2 * dVar2;
    dVar3 = auVar22._8_8_;
    auVar49._8_8_ = dVar3 * dVar3;
    auVar43._0_8_ = dVar2 * 0.5;
    auVar43._8_8_ = dVar3 * 0.5;
    auVar22 = vsubpd_avx(auVar49,auVar43);
    auVar57._0_8_ = dVar2 * auVar49._0_8_ * 0.5;
    auVar57._8_8_ = dVar3 * auVar49._8_8_ * 0.5;
    auVar22 = vsubpd_avx(auVar22,auVar57);
    auVar51._0_8_ = dVar2 * auVar49._0_8_ * 1.5;
    auVar51._8_8_ = dVar3 * auVar49._8_8_ * 1.5;
    auVar28._0_8_ = auVar43._0_8_ + auVar49._0_8_ + auVar49._0_8_;
    auVar28._8_8_ = auVar43._8_8_ + auVar49._8_8_ + auVar49._8_8_;
    auVar28 = vsubpd_avx(auVar28,auVar51);
    auVar44._0_8_ = auVar49._0_8_ * 0.5;
    auVar44._8_8_ = auVar49._8_8_ * 0.5;
    auVar41 = vsubpd_avx(auVar57,auVar44);
    auVar50._0_8_ = auVar22._0_8_ * 16384.0;
    auVar50._8_8_ = auVar22._8_8_ * 16384.0;
    auVar22 = vroundpd_avx(auVar50,8);
    auVar23._0_8_ = (auVar49._0_8_ * -2.5 + 1.0 + auVar51._0_8_) * 16384.0;
    auVar23._8_8_ = (auVar49._8_8_ * -2.5 + 1.0 + auVar51._8_8_) * 16384.0;
    auVar23 = vroundpd_avx(auVar23,8);
    auVar29._0_8_ = auVar28._0_8_ * 16384.0;
    auVar29._8_8_ = auVar28._8_8_ * 16384.0;
    auVar28 = vroundpd_avx(auVar29,8);
    auVar45._0_8_ = auVar41._0_8_ * 16384.0;
    auVar45._8_8_ = auVar41._8_8_ * 16384.0;
    auVar41 = vroundpd_avx(auVar45,8);
    auVar22 = vcvtpd2dq_avx(auVar22);
    auVar23 = vcvtpd2dq_avx(auVar23);
    auVar28 = vcvtpd2dq_avx(auVar28);
    auVar41 = vcvtpd2dq_avx(auVar41);
    iVar14 = (int)auVar30._0_8_ + x;
    iVar10 = width;
    if (iVar14 < width) {
      iVar10 = iVar14;
    }
    iVar10 = iVar10 + -1;
    iVar16 = (int)auVar36._0_8_ + y;
    iVar13 = height;
    if (iVar16 < height) {
      iVar13 = iVar16;
    }
    auVar22 = vpunpckldq_avx(auVar22,auVar23);
    if (iVar16 < -9) {
      iVar13 = -9;
    }
    auVar23 = vpunpckldq_avx(auVar28,auVar41);
    if (iVar14 < -9) {
      iVar10 = -10;
    }
    auVar22 = vpackssdw_avx(auVar22,auVar23);
    uVar21 = auVar22._0_4_;
    auVar46._4_4_ = uVar21;
    auVar46._0_4_ = uVar21;
    auVar46._8_4_ = uVar21;
    auVar46._12_4_ = uVar21;
    auVar46._16_4_ = uVar21;
    auVar46._20_4_ = uVar21;
    auVar46._24_4_ = uVar21;
    auVar46._28_4_ = uVar21;
    auVar23 = vpackssdw_avx(auVar23,auVar23);
    uVar21 = auVar23._0_4_;
    auVar52._4_4_ = uVar21;
    auVar52._0_4_ = uVar21;
    auVar52._8_4_ = uVar21;
    auVar52._12_4_ = uVar21;
    auVar52._16_4_ = uVar21;
    auVar52._20_4_ = uVar21;
    auVar52._24_4_ = uVar21;
    auVar52._28_4_ = uVar21;
    puVar18 = ref + iVar10;
    lVar17 = -3;
    pauVar12 = (undefined1 (*) [32])local_220;
    do {
      auVar32._0_16_ =
           ZEXT116(0) * *(undefined1 (*) [16])(puVar18 + (long)iVar13 * uVar9) +
           ZEXT116(1) * *(undefined1 (*) [16])(puVar18 + ((long)iVar13 + -1) * uVar9);
      auVar32._16_16_ =
           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
           ZEXT116(1) * *(undefined1 (*) [16])(puVar18 + (long)iVar13 * uVar9);
      auVar34 = vpunpcklbw_avx2(auVar32,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
      auVar33 = vpshufb_avx2(auVar32,auVar54);
      auVar26 = vpshufb_avx2(auVar34,auVar7);
      auVar34 = vpshufb_avx2(auVar34,auVar8);
      auVar26 = vpmaddwd_avx2(auVar26,auVar46);
      auVar34 = vpmaddwd_avx2(auVar34,auVar52);
      auVar26 = vpaddd_avx2(auVar26,auVar34);
      auVar26 = vpaddd_avx2(auVar55,auVar26);
      auVar32 = vpsrad_avx2(auVar26,8);
      auVar26 = vpshufb_avx2(auVar33,auVar7);
      auVar34 = vpshufb_avx2(auVar33,auVar8);
      auVar26 = vpmaddwd_avx2(auVar26,auVar46);
      auVar34 = vpmaddwd_avx2(auVar34,auVar52);
      auVar26 = vpaddd_avx2(auVar26,auVar34);
      auVar26 = vpaddd_avx2(auVar55,auVar26);
      auVar26 = vpsrad_avx2(auVar26,8);
      auVar26 = vpackssdw_avx2(auVar32,auVar26);
      *pauVar12 = auVar26;
      lVar17 = lVar17 + 2;
      pauVar12 = pauVar12 + 1;
      puVar18 = puVar18 + lVar11;
    } while (lVar17 < 8);
    auVar23 = vpshufd_avx(auVar22,0x55);
    uVar21 = auVar23._0_4_;
    auVar47._4_4_ = uVar21;
    auVar47._0_4_ = uVar21;
    auVar47._8_4_ = uVar21;
    auVar47._12_4_ = uVar21;
    auVar47._16_4_ = uVar21;
    auVar47._20_4_ = uVar21;
    auVar47._24_4_ = uVar21;
    auVar47._28_4_ = uVar21;
    auVar22 = vpshufd_avx(auVar22,0xff);
    uVar21 = auVar22._0_4_;
    auVar53._4_4_ = uVar21;
    auVar53._0_4_ = uVar21;
    auVar53._8_4_ = uVar21;
    auVar53._12_4_ = uVar21;
    auVar53._16_4_ = uVar21;
    auVar53._20_4_ = uVar21;
    auVar53._24_4_ = uVar21;
    auVar53._28_4_ = uVar21;
    auVar27 = ZEXT1664((undefined1  [16])0x0);
    uVar15 = 0xfffffffffffffffe;
    lVar17 = 0;
    auVar35 = ZEXT1664((undefined1  [16])0x0);
    puVar18 = src + x;
    do {
      auVar26 = vpunpcklwd_avx2(*(undefined1 (*) [32])(local_220 + lVar17),
                                *(undefined1 (*) [32])(auStack_210 + lVar17));
      auVar26 = vpmaddwd_avx2(auVar26,auVar47);
      auVar34 = vpunpcklwd_avx2(*(undefined1 (*) [32])(auStack_200 + lVar17),
                                *(undefined1 (*) [32])(auStack_1f0 + lVar17));
      auVar34 = vpmaddwd_avx2(auVar34,auVar53);
      auVar26 = vpaddd_avx2(auVar26,auVar34);
      auVar34 = vpunpckhwd_avx2(*(undefined1 (*) [32])(local_220 + lVar17),
                                *(undefined1 (*) [32])(auStack_210 + lVar17));
      auVar34 = vpmaddwd_avx2(auVar34,auVar47);
      auVar33 = vpunpckhwd_avx2(*(undefined1 (*) [32])(auStack_200 + lVar17),
                                *(undefined1 (*) [32])(auStack_1f0 + lVar17));
      auVar33 = vpmaddwd_avx2(auVar33,auVar53);
      auVar34 = vpaddd_avx2(auVar34,auVar33);
      auVar26 = vpaddd_avx2(auVar56,auVar26);
      auVar33 = vpsrad_avx2(auVar26,0x11);
      auVar26 = vpaddd_avx2(auVar56,auVar34);
      auVar26 = vpsrad_avx2(auVar26,0x11);
      auVar26 = vpackssdw_avx2(auVar33,auVar26);
      auVar30._8_8_ = 0;
      auVar30._0_8_ = *(ulong *)(puVar18 + ((long)y + 1) * uVar9);
      auVar36._8_8_ = 0;
      auVar36._0_8_ = *(ulong *)(puVar18 + uVar9 * (long)y);
      auVar22 = vpunpcklqdq_avx(auVar36,auVar30);
      auVar34 = vpmovzxbw_avx2(auVar22);
      auVar34 = vpsllw_avx2(auVar34,3);
      auVar34 = vpsubw_avx2(auVar26,auVar34);
      auVar26 = vpmaddwd_avx2(auVar34,*(undefined1 (*) [32])(auStack_e0 + lVar17));
      auVar26 = vpaddd_avx2(auVar26,auVar27._0_32_);
      auVar27 = ZEXT3264(auVar26);
      auVar34 = vpmaddwd_avx2(auVar34,*(undefined1 (*) [32])(auStack_160 + lVar17));
      auVar34 = vpaddd_avx2(auVar34,auVar35._0_32_);
      auVar35 = ZEXT3264(auVar34);
      uVar15 = uVar15 + 2;
      puVar18 = puVar18 + lVar11;
      lVar17 = lVar17 + 0x20;
    } while (uVar15 < 6);
    auVar26 = vphaddd_avx2(auVar26,auVar34);
    auVar22 = vpaddd_avx(auVar26._0_16_,auVar26._16_16_);
    auVar23 = vphaddd_avx(auVar22,auVar22);
    auVar22 = vcvtdq2pd_avx(auVar23);
    auVar23 = vpshufd_avx(auVar23,0xff);
    auVar23 = vcvtdq2pd_avx(auVar23);
    dVar2 = auVar22._0_8_ * auVar4._0_8_ * dVar40 + auVar23._0_8_ * dVar40 * -auVar5._0_8_;
    dVar3 = auVar22._0_8_ * dVar40 * -auVar31._16_8_ + auVar23._0_8_ * auVar31._0_8_ * dVar40;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = dVar2;
    auVar23 = vminsd_avx(ZEXT816(0x4000000000000000),auVar37);
    auVar28 = ZEXT816(0xc000000000000000);
    auVar22 = vcmpsd_avx(auVar37,auVar28,1);
    auVar22 = vblendvpd_avx(auVar23,auVar28,auVar22);
    *u = auVar22._0_8_ + dVar1;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = dVar3;
    auVar23 = vminsd_avx(ZEXT816(0x4000000000000000),auVar24);
    auVar22 = vcmpsd_avx(auVar24,auVar28,1);
    auVar22 = vblendvpd_avx(auVar23,auVar28,auVar22);
    *v = auVar22._0_8_ + *v;
    auVar6._8_8_ = 0x7fffffffffffffff;
    auVar6._0_8_ = 0x7fffffffffffffff;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = dVar2;
    auVar22 = vandpd_avx(auVar38,auVar6);
    auVar25._8_8_ = 0;
    auVar25._0_8_ = dVar3;
    auVar23 = vandpd_avx(auVar25,auVar6);
  } while ((0.125 <= auVar22._0_8_ + auVar23._0_8_) && (iVar19 = iVar19 + 1, iVar19 != 4));
  return;
}

Assistant:

void aom_compute_flow_at_point_avx2(const uint8_t *src, const uint8_t *ref,
                                    int x, int y, int width, int height,
                                    int stride, double *u, double *v) {
  DECLARE_ALIGNED(32, double, M[4]);
  DECLARE_ALIGNED(32, double, M_inv[4]);
  DECLARE_ALIGNED(32, int16_t, dx[DISFLOW_PATCH_SIZE * DISFLOW_PATCH_SIZE]);
  DECLARE_ALIGNED(32, int16_t, dy[DISFLOW_PATCH_SIZE * DISFLOW_PATCH_SIZE]);
  int b[2];

  // Compute gradients within this patch
  const uint8_t *src_patch = &src[y * stride + x];
  sobel_filter(src_patch, stride, dx, dy);

  compute_flow_matrix(dx, DISFLOW_PATCH_SIZE, dy, DISFLOW_PATCH_SIZE, M);
  invert_2x2(M, M_inv);

  for (int itr = 0; itr < DISFLOW_MAX_ITR; itr++) {
    compute_flow_vector(src, ref, width, height, stride, x, y, *u, *v, dx, dy,
                        b);

    // Solve flow equations to find a better estimate for the flow vector
    // at this point
    const double step_u = M_inv[0] * b[0] + M_inv[1] * b[1];
    const double step_v = M_inv[2] * b[0] + M_inv[3] * b[1];
    *u += fclamp(step_u * DISFLOW_STEP_SIZE, -2, 2);
    *v += fclamp(step_v * DISFLOW_STEP_SIZE, -2, 2);

    if (fabs(step_u) + fabs(step_v) < DISFLOW_STEP_SIZE_THRESOLD) {
      // Stop iteration when we're close to convergence
      break;
    }
  }
}